

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O3

void Js::AsmJsByteCodeDumper::DumpConstants(AsmJsFunc *func,FunctionBody *body)

{
  bool bVar1;
  RegisterSpace *pRVar2;
  TypedRegisterAllocator *this;
  ulong uVar3;
  char16 buf [32];
  TypedConstSourcesInfo constSrcInfos;
  
  this = &func->mTypedRegisterAllocator;
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos((TypedConstSourcesInfo *)(buf + 0x1c),this);
  uVar3 = 0;
  do {
    bVar1 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded(this,(Types)uVar3);
    if (!bVar1) {
      pRVar2 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this,(Types)uVar3);
      if (pRVar2->mNbConst != 0) {
        (*(code *)((long)&DAT_010b2db8 + (long)(int)(&DAT_010b2db8)[uVar3 & 0xffffffff]))();
        return;
      }
      Output::Print(L"\n");
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 5);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpConstants(AsmJsFunc* func, FunctionBody* body)
    {
        byte* table = (byte*)body->GetConstTable();
        auto constSrcInfos = func->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            if (func->GetTypedRegisterAllocator().IsTypeExcluded(type))
            {
                continue;
            }
            uint constCount = func->GetTypedRegisterAllocator().GetRegisterSpace(type)->GetConstCount();
            if (constCount > 0)
            {
                uint offset = constSrcInfos.srcByteOffsets[i];
                byte* tableOffseted = table + offset;
                switch (type)
                {
                case WAsmJs::INT32:   PrintTypedConstants<int>(tableOffseted, type, constCount, [](int v) {Output::Print(_u("%d"), v);}); break;
                case WAsmJs::INT64:   PrintTypedConstants<int64>(tableOffseted, type, constCount, [](int64 v) {Output::Print(_u("%lld"), v);}); break;
                case WAsmJs::FLOAT32: PrintTypedConstants<float>(tableOffseted, type, constCount, [](float v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::FLOAT64: PrintTypedConstants<double>(tableOffseted, type, constCount, [](double v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::SIMD:    PrintTypedConstants<AsmJsSIMDValue>(tableOffseted, type, constCount, [](AsmJsSIMDValue v) {
                    Output::Print(_u("\n       I32(%d, %d, %d, %d),"), v.i32[SIMD_X], v.i32[SIMD_Y], v.i32[SIMD_Z], v.i32[SIMD_W]);
                    Output::Print(_u("\n       F32(%.4f, %.4f, %.4f, %.4f),"), v.f32[SIMD_X], v.f32[SIMD_Y], v.f32[SIMD_Z], v.f32[SIMD_W]);
                    Output::Print(_u("\n       D64(%.4f, %.4f),"), v.f64[SIMD_X], v.f64[SIMD_Y]);
                    Output::Print(_u("\n       I8(%d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d)"),
                                  v.i8[0], v.i8[1], v.i8[2], v.i8[3], v.i8[4], v.i8[5], v.i8[6], v.i8[7],
                                  v.i8[8], v.i8[9], v.i8[10], v.i8[11], v.i8[12], v.i8[13], v.i8[14], v.i8[15]);
                    });
                    break;
                default:
                    Assert(false);
                    break;
                }
            }
            Output::Print(_u("\n"));
        }
    }